

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGuiStb::STB_TEXTEDIT_DELETECHARS(ImGuiTextEditState *obj,int pos,int n)

{
  int iVar1;
  ImWchar *in_text;
  
  in_text = (obj->Text).Data + pos;
  iVar1 = ImTextCountUtf8BytesFromStr(in_text,in_text + n);
  obj->CurLenA = obj->CurLenA - iVar1;
  obj->CurLenW = obj->CurLenW - n;
  for (; in_text[n] != 0; in_text = in_text + 1) {
    *in_text = in_text[n];
  }
  *in_text = 0;
  return;
}

Assistant:

static void STB_TEXTEDIT_DELETECHARS(STB_TEXTEDIT_STRING* obj, int pos, int n)
{
    ImWchar* dst = obj->Text.Data + pos;

    // We maintain our buffer length in both UTF-8 and wchar formats
    obj->CurLenA -= ImTextCountUtf8BytesFromStr(dst, dst + n);
    obj->CurLenW -= n;

    // Offset remaining text
    const ImWchar* src = obj->Text.Data + pos + n;
    while (ImWchar c = *src++)
        *dst++ = c;
    *dst = '\0';
}